

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateBreakUpvalueClose
          (ExpressionContext *ctx,SynBase *source,FunctionData *onwerFunction,ScopeData *fromScope,
          uint depth)

{
  int iVar1;
  undefined4 extraout_var;
  CloseUpvaluesData *node;
  IntrusiveList<CloseUpvaluesData> *this_00;
  ExprSequence *this;
  undefined4 extraout_var_00;
  
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  this = (ExprSequence *)CONCAT44(extraout_var,iVar1);
  ExprSequence::ExprSequence
            (this,ctx->allocator,source,ctx->typeVoid,(ArrayView<ExprBase_*>)ZEXT816(0));
  this_00 = &onwerFunction->closeUpvalues;
  if (onwerFunction == (FunctionData *)0x0) {
    this_00 = &ctx->globalCloseUpvalues;
  }
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  node = (CloseUpvaluesData *)CONCAT44(extraout_var_00,iVar1);
  node->expr = this;
  node->type = CLOSE_UPVALUES_BREAK;
  node->source = source;
  node->scope = fromScope;
  node->depth = depth;
  node->next = (CloseUpvaluesData *)0x0;
  node->listed = false;
  IntrusiveList<CloseUpvaluesData>::push_back(this_00,node);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* CreateBreakUpvalueClose(ExpressionContext &ctx, SynBase *source, FunctionData *onwerFunction, ScopeData *fromScope, unsigned depth)
{
	ExprSequence *holder = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, ctx.typeVoid, ArrayView<ExprBase*>());

	IntrusiveList<CloseUpvaluesData> &closeUpvalues = onwerFunction ? onwerFunction->closeUpvalues : ctx.globalCloseUpvalues;

	closeUpvalues.push_back(new (ctx.get<CloseUpvaluesData>()) CloseUpvaluesData(holder, CLOSE_UPVALUES_BREAK, source, fromScope, depth));

	return holder;
}